

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O2

void do_cmd_pref(void)

{
  _Bool _Var1;
  char tmp [80];
  
  my_strcpy(tmp,"",0x50);
  _Var1 = get_string("Pref: ",tmp,0x50);
  if (_Var1) {
    process_pref_file_command(tmp);
  }
  return;
}

Assistant:

void do_cmd_pref(void)
{
	char tmp[80];

	/* Default */
	my_strcpy(tmp, "", sizeof(tmp));

	/* Ask for a "user pref command" */
	if (!get_string("Pref: ", tmp, 80)) return;

	/* Process that pref command */
	(void)process_pref_file_command(tmp);
}